

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O0

size_t __thiscall zmq::msg_t::size(msg_t *this)

{
  bool bVar1;
  msg_t *in_RDI;
  ulong local_8;
  
  bVar1 = check(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","check ()",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x19e);
    fflush(_stderr);
    zmq_abort((char *)0x1e810c);
  }
  switch((in_RDI->_u).base.type) {
  case 'e':
    local_8 = (ulong)(in_RDI->_u).base.unused[0x21];
    break;
  case 'f':
    local_8 = ((in_RDI->_u).lmsg.content)->size;
    break;
  default:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","false",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/msg.cpp"
            ,0x1aa);
    fflush(_stderr);
    zmq_abort((char *)0x1e81cf);
    local_8 = 0;
    break;
  case 'h':
    local_8 = (in_RDI->_u).cmsg.size;
    break;
  case 'i':
    local_8 = ((in_RDI->_u).lmsg.content)->size;
  }
  return local_8;
}

Assistant:

size_t zmq::msg_t::size () const
{
    //  Check the validity of the message.
    zmq_assert (check ());

    switch (_u.base.type) {
        case type_vsm:
            return _u.vsm.size;
        case type_lmsg:
            return _u.lmsg.content->size;
        case type_zclmsg:
            return _u.zclmsg.content->size;
        case type_cmsg:
            return _u.cmsg.size;
        default:
            zmq_assert (false);
            return 0;
    }
}